

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Base_ptr p_Var3;
  long lVar4;
  bool bVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  string newline;
  string arg;
  key_type local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  bVar5 = cmsys::RegularExpression::find
                    (&this->IncludeRegexTransform,(line->_M_dataplus)._M_p,
                     &(this->IncludeRegexTransform).regmatch);
  if (bVar5) {
    pcVar2 = (this->IncludeRegexTransform).regmatch.startp[3];
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar2 == (char *)0x0) {
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar2,(this->IncludeRegexTransform).regmatch.endp[3]);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->TransformRules)._M_t,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((_Rb_tree_header *)iVar6._M_node !=
        &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header) {
      pcVar2 = (this->IncludeRegexTransform).regmatch.startp[1];
      if (pcVar2 == (char *)0x0) {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar2,(this->IncludeRegexTransform).regmatch.endp[1]);
      }
      pcVar2 = (this->IncludeRegexTransform).regmatch.startp[4];
      if (pcVar2 == (char *)0x0) {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pcVar2,(this->IncludeRegexTransform).regmatch.endp[4]);
      }
      p_Var3 = iVar6._M_node[2]._M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        lVar4 = *(long *)(iVar6._M_node + 2);
        p_Var7 = (_Base_ptr)0x0;
        do {
          if (*(char *)((long)&p_Var7->_M_color + lVar4) == '%') {
            std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
          }
          else {
            std::__cxx11::string::push_back((char)&local_70);
          }
          p_Var7 = (_Base_ptr)((long)&p_Var7->_M_color + 1);
        } while (p_Var3 != p_Var7);
      }
      std::__cxx11::string::_M_assign((string *)line);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if (!this->IncludeRegexTransform.find(line)) {
    return;
  }
  TransformRulesType::const_iterator tri =
    this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if (tri == this->TransformRules.end()) {
    return;
  }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for (char c : tri->second) {
    if (c == '%') {
      newline += arg;
    } else {
      newline += c;
    }
  }

  // Return the transformed line.
  line = newline;
}